

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_cipher_cleanup(EVP_CIPHER_CTX *ctx)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  gost_grasshopper_cipher_ctx *in_RDI;
  gost_grasshopper_cipher_ctx *c;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  if (lVar2 != 0) {
    uVar3 = EVP_CIPHER_CTX_get0_cipher(in_RDI);
    iVar1 = EVP_CIPHER_get_mode(uVar3);
    if (iVar1 == 5) {
      gost_grasshopper_cipher_destroy_ctr(in_RDI);
    }
    EVP_CIPHER_CTX_set_app_data((EVP_CIPHER_CTX *)in_RDI,(void *)0x0);
  }
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_cleanup(EVP_CIPHER_CTX *ctx)
{
    gost_grasshopper_cipher_ctx *c =
        (gost_grasshopper_cipher_ctx *) EVP_CIPHER_CTX_get_cipher_data(ctx);

    if (!c)
        return 1;

    if (EVP_CIPHER_CTX_mode(ctx) == EVP_CIPH_CTR_MODE)
        gost_grasshopper_cipher_destroy_ctr(c);

    EVP_CIPHER_CTX_set_app_data(ctx, NULL);

    return 1;
}